

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

char * S2BooleanOperation::OpTypeToString(OpType op_type)

{
  if (op_type < 4) {
    return &DAT_00245600 + *(int *)(&DAT_00245600 + (ulong)op_type * 4);
  }
  return "Unknown OpType";
}

Assistant:

const char* S2BooleanOperation::OpTypeToString(OpType op_type) {
  switch (op_type) {
    case OpType::UNION:                return "UNION";
    case OpType::INTERSECTION:         return "INTERSECTION";
    case OpType::DIFFERENCE:           return "DIFFERENCE";
    case OpType::SYMMETRIC_DIFFERENCE: return "SYMMETRIC DIFFERENCE";
    default:                           return "Unknown OpType";
  }
}